

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcSetGlobal(char *name,void *data)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
LAB_0021c216:
    bVar9 = false;
  }
  else {
    bVar8 = false;
    pvVar4 = nullcGetVariableData((uint *)0x0);
    bVar9 = false;
    if ((((pvVar4 != (void *)0x0) && (bVar9 = bVar8, data != (void *)0x0)) && (name != (char *)0x0))
       && (NULLC::linker != 0)) {
      uVar3 = NULLC::GetStringHash(name);
      uVar2 = *(uint *)(NULLC::linker + 0x23c);
      bVar9 = uVar2 != 0;
      if (bVar9) {
        lVar5 = *(long *)(NULLC::linker + 0x230);
        if (*(uint *)(lVar5 + 4) != uVar3) {
          uVar7 = 0;
          lVar6 = lVar5;
          do {
            if (uVar2 - 1 == uVar7) goto LAB_0021c216;
            lVar5 = lVar6 + 0x10;
            uVar7 = uVar7 + 1;
            puVar1 = (uint *)(lVar6 + 0x14);
            lVar6 = lVar5;
          } while (*puVar1 != uVar3);
          bVar9 = uVar7 < uVar2;
        }
        if (*(uint *)(NULLC::linker + 0x20c) <= *(uint *)(lVar5 + 8)) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,
                        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        memcpy((void *)((long)pvVar4 + (ulong)*(uint *)(lVar5 + 0xc)),data,
               (ulong)*(uint *)(*(long *)(NULLC::linker + 0x200) + 4 +
                               (ulong)*(uint *)(lVar5 + 8) * 0x50));
      }
    }
  }
  return bVar9;
}

Assistant:

nullres nullcSetGlobal(const char* name, void* data)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	char* mem = (char*)nullcGetVariableData(NULL);
	if(!linker || !name || !data || !mem)
		return 0;
	unsigned hash = GetStringHash(name);
	for(unsigned i = 0; i < linker->exVariables.size(); i++)
	{
		if(linker->exVariables[i].nameHash == hash)
		{
			memcpy(mem + linker->exVariables[i].offset, data, linker->exTypes[linker->exVariables[i].type].size);
			return 1;
		}
	}
	return 0;
}